

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O0

bool ReadBlockDevice(string *path,shared_ptr<Disk> *disk)

{
  Format *this;
  bool bVar1;
  pointer pBVar2;
  exception *peVar3;
  element_type *peVar4;
  CylHead local_90;
  undefined1 local_88 [8];
  shared_ptr<BlockFloppyDisk> blk_dev_disk;
  int iStack_70;
  Format fmt;
  unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_> local_28;
  __single_object blockdev;
  shared_ptr<Disk> *disk_local;
  string *path_local;
  
  blockdev._M_t.super___uniq_ptr_impl<BlockDevice,_std::default_delete<BlockDevice>_>._M_t.
  super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
  super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl =
       (__uniq_ptr_data<BlockDevice,_std::default_delete<BlockDevice>,_true,_true>)
       (__uniq_ptr_data<BlockDevice,_std::default_delete<BlockDevice>,_true,_true>)disk;
  bVar1 = IsBlockDevice(path);
  if (bVar1) {
    std::make_unique<BlockDevice>();
    pBVar2 = std::unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_>::operator->(&local_28);
    bVar1 = BlockDevice::Open(pBVar2,path,true);
    if (bVar1) {
      this = (Format *)
             ((long)&blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
      Format::Format(this);
      pBVar2 = std::unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_>::operator->
                         (&local_28);
      bVar1 = Format::FromSize((pBVar2->super_HDD).total_bytes,this);
      if (!bVar1) {
        peVar3 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20]>(peVar3,(char (*) [20])"not a floppy device");
        __cxa_throw(peVar3,&util::exception::typeinfo,util::exception::~exception);
      }
      if ((int)fmt.datarate < opt.sectors) {
        peVar3 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[25],int&>
                  (peVar3,(char (*) [25])"sector count must be <= ",(int *)&fmt.datarate);
        __cxa_throw(peVar3,&util::exception::typeinfo,util::exception::~exception);
      }
      if (0 < opt.sectors) {
        fmt.datarate = (DataRate)opt.sectors;
      }
      std::
      make_shared<BlockFloppyDisk,std::unique_ptr<BlockDevice,std::default_delete<BlockDevice>>>
                ((unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_> *)local_88);
      peVar4 = std::__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      CylHead::CylHead(&local_90,
                       blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_ + -1,iStack_70 + -1);
      DemandDisk::extend(&peVar4->super_DemandDisk,&local_90);
      peVar4 = std::__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      *(ulong *)((long)&(peVar4->super_DemandDisk).super_Disk.fmt.skew + 2) =
           CONCAT26((undefined2)fmt.skew,fmt._34_6_);
      *(undefined8 *)((long)&(peVar4->super_DemandDisk).super_Disk.fmt.head1 + 2) = fmt._42_8_;
      (peVar4->super_DemandDisk).super_Disk.fmt.offset = fmt.size;
      (peVar4->super_DemandDisk).super_Disk.fmt.interleave = fmt.base;
      (peVar4->super_DemandDisk).super_Disk.fmt.skew =
           (int)CONCAT62(fmt._34_6_,(undefined2)fmt.offset);
      (peVar4->super_DemandDisk).super_Disk.fmt.head0 = fmt.interleave;
      (peVar4->super_DemandDisk).super_Disk.fmt.encoding = fmt.fdc;
      (peVar4->super_DemandDisk).super_Disk.fmt.sectors = fmt.datarate;
      (peVar4->super_DemandDisk).super_Disk.fmt.size = fmt.encoding;
      (peVar4->super_DemandDisk).super_Disk.fmt.base = fmt.sectors;
      (peVar4->super_DemandDisk).super_Disk.fmt.cyls =
           blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_;
      (peVar4->super_DemandDisk).super_Disk.fmt.heads = iStack_70;
      (peVar4->super_DemandDisk).super_Disk.fmt.fdc = fmt.cyls;
      (peVar4->super_DemandDisk).super_Disk.fmt.datarate = fmt.heads;
      peVar4 = std::__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      std::__cxx11::string::operator=
                ((string *)&(peVar4->super_DemandDisk).super_Disk.strType,"Block Floppy Device");
      std::shared_ptr<Disk>::operator=
                ((shared_ptr<Disk> *)
                 blockdev._M_t.super___uniq_ptr_impl<BlockDevice,_std::default_delete<BlockDevice>_>
                 ._M_t.super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
                 super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl,
                 (shared_ptr<BlockFloppyDisk> *)local_88);
      path_local._7_1_ = true;
      fmt.gap3 = 1;
      std::shared_ptr<BlockFloppyDisk>::~shared_ptr((shared_ptr<BlockFloppyDisk> *)local_88);
    }
    else {
      path_local._7_1_ = false;
      fmt.gap3 = 1;
    }
    std::unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_>::~unique_ptr(&local_28);
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool ReadBlockDevice(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (!IsBlockDevice(path))
        return false;

    auto blockdev = std::make_unique<BlockDevice>();
    if (!blockdev->Open(path, true))
        return false;

    Format fmt;
    if (!Format::FromSize(blockdev->total_bytes, fmt))
        throw util::exception("not a floppy device");

    // Allow subsets of the track format
    if (opt.sectors > fmt.sectors)
        throw util::exception("sector count must be <= ", fmt.sectors);
    else if (opt.sectors > 0)
        fmt.sectors = opt.sectors;

    auto blk_dev_disk = std::make_shared<BlockFloppyDisk>(std::move(blockdev));
    blk_dev_disk->extend(CylHead(fmt.cyls - 1, fmt.heads - 1));
    blk_dev_disk->fmt = fmt;

    blk_dev_disk->strType = "Block Floppy Device";
    disk = blk_dev_disk;

    return true;
}